

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.h
# Opt level: O1

bool __thiscall
std::equal_to<luna::Value>::operator()(equal_to<luna::Value> *this,Value *__x,Value *__y)

{
  bool bVar1;
  
  if (__x->type_ != __y->type_) {
switchD_0015966b_default:
    return false;
  }
  switch(__x->type_) {
  case ValueT_Nil:
    return true;
  case ValueT_Bool:
    bVar1 = (__x->field_0).bvalue_ == (__y->field_0).bvalue_;
    break;
  case ValueT_Number:
    return (bool)(-((__y->field_0).num_ == (__x->field_0).num_) & 1);
  case ValueT_Obj:
  case ValueT_String:
  case ValueT_Closure:
  case ValueT_Upvalue:
  case ValueT_Table:
  case ValueT_UserData:
  case ValueT_CFunction:
    bVar1 = (__x->field_0).obj_ == (__y->field_0).obj_;
    break;
  default:
    goto switchD_0015966b_default;
  }
  return bVar1;
}

Assistant:

inline bool operator == (const Value &left, const Value &right)
    {
        if (left.type_ != right.type_)
            return false;

        switch (left.type_)
        {
            case ValueT_Nil: return true;
            case ValueT_Bool: return left.bvalue_ == right.bvalue_;
            case ValueT_Number: return left.num_ == right.num_;
            case ValueT_Obj: return left.obj_ == right.obj_;
            case ValueT_String: return left.str_ == right.str_;
            case ValueT_Closure: return left.closure_ == right.closure_;
            case ValueT_Upvalue: return left.upvalue_ == right.upvalue_;
            case ValueT_Table: return left.table_ == right.table_;
            case ValueT_UserData: return left.user_data_ == right.user_data_;
            case ValueT_CFunction: return left.cfunc_ == right.cfunc_;
        }

        return false;
    }